

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Variant_decodeBinary(UA_Variant *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  ulong uVar2;
  UA_Byte *pUVar3;
  bool bVar4;
  bool bVar5;
  size_t typeIndex;
  uint local_28;
  UA_Boolean isArray;
  UA_StatusCode retval;
  UA_Byte encodingByte;
  UA_DataType *__local;
  UA_Variant *dst_local;
  
  _retval = _;
  __local = (UA_DataType *)dst;
  dst_local._4_4_ = Byte_decodeBinary(&isArray,(UA_DataType *)0x0);
  if (dst_local._4_4_ == 0) {
    if (isArray == false) {
      dst_local._4_4_ = 0;
    }
    else {
      bVar5 = -1 < (int)(isArray & 0x80);
      bVar4 = (isArray & 0x80U) != 0;
      uVar2 = (ulong)(int)((isArray & 0x3f) - 1);
      if (uVar2 < 0x19) {
        __local->typeName = (char *)(UA_TYPES + uVar2);
        if (bVar4 && bVar5) {
          local_28 = Array_decodeBinary(&(__local->typeId).identifier.string.data,
                                        (size_t *)&(__local->typeId).identifier.numeric,
                                        (UA_DataType *)__local->typeName);
        }
        else if (uVar2 == 0x15) {
          local_28 = Variant_decodeBinaryUnwrapExtensionObject((UA_Variant *)__local);
        }
        else {
          pUVar3 = (UA_Byte *)UA_new((UA_DataType *)__local->typeName);
          (__local->typeId).identifier.string.data = pUVar3;
          if ((__local->typeId).identifier.string.data == (UA_Byte *)0x0) {
            return 0x80030000;
          }
          local_28 = (*decodeBinaryJumpTable[uVar2])
                               ((__local->typeId).identifier.string.data,
                                (UA_DataType *)__local->typeName);
        }
        if ((bVar4 && bVar5) && ((isArray & 0x40U) != 0)) {
          UVar1 = Array_decodeBinary(&__local->members,(size_t *)&__local->memSize,UA_TYPES + 5);
          local_28 = UVar1 | local_28;
        }
        dst_local._4_4_ = local_28;
      }
      else {
        dst_local._4_4_ = 0x80070000;
      }
    }
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
Variant_decodeBinary(UA_Variant *dst, const UA_DataType *_) {
    /* Decode the encoding byte */
    UA_Byte encodingByte;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Return early for an empty variant (was already _inited) */
    if(encodingByte == 0)
        return UA_STATUSCODE_GOOD;

    /* Does the variant contain an array? */
    const UA_Boolean isArray = (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_ARRAY) > 0;

    /* Get the datatype of the content. The type must be a builtin data type.
     * All not-builtin types are wrapped in an ExtensionObject. */
    size_t typeIndex = (size_t)((encodingByte & UA_VARIANT_ENCODINGMASKTYPE_TYPEID_MASK) - 1);
    if(typeIndex > UA_TYPES_DIAGNOSTICINFO)
        return UA_STATUSCODE_BADDECODINGERROR;
    dst->type = &UA_TYPES[typeIndex];

    /* Decode the content */
    if(isArray) {
        retval = Array_decodeBinary(&dst->data, &dst->arrayLength, dst->type);
    } else if(typeIndex != UA_TYPES_EXTENSIONOBJECT) {
        dst->data = UA_new(dst->type);
        if(!dst->data)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = decodeBinaryJumpTable[typeIndex](dst->data, dst->type);
    } else {
        retval = Variant_decodeBinaryUnwrapExtensionObject(dst);
    }

    /* Decode array dimensions */
    if(isArray && (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_DIMENSIONS) > 0)
        retval |= Array_decodeBinary((void**)&dst->arrayDimensions,
                                     &dst->arrayDimensionsSize, &UA_TYPES[UA_TYPES_INT32]);
    return retval;
}